

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgztexture.cpp
# Opt level: O1

FTexture * IMGZTexture_TryCreate(FileReader *file,int lumpnum)

{
  int iVar1;
  undefined4 extraout_var;
  FIMGZTexture *this;
  WORD w;
  DWORD magic;
  SWORD t;
  SWORD l;
  WORD h;
  WORD local_3e;
  int local_3c;
  SWORD local_36;
  SWORD local_34;
  WORD local_32;
  
  local_3c = 0;
  this = (FIMGZTexture *)0x0;
  (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
  iVar1 = (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_3c,4);
  if ((CONCAT44(extraout_var,iVar1) == 4) && (local_3c == 0x5a474d49)) {
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_3e,2);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_32,2);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_34,2);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_36,2);
    this = (FIMGZTexture *)operator_new(0xa8);
    FIMGZTexture::FIMGZTexture(this,lumpnum,local_3e,local_32,local_34,local_36);
  }
  return &this->super_FTexture;
}

Assistant:

FTexture *IMGZTexture_TryCreate(FileReader & file, int lumpnum)
{
	DWORD magic = 0;
	WORD w, h;
	SWORD l, t;

	file.Seek(0, SEEK_SET);
	if (file.Read(&magic, 4) != 4) return NULL;
	if (magic != MAKE_ID('I','M','G','Z')) return NULL;
	file >> w >> h >> l >> t;
	return new FIMGZTexture(lumpnum, w, h, l, t);
}